

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_variable * pugi::impl::anon_unknown_0::new_xpath_variable(xpath_value_type type,char_t *name)

{
  char_t *name_local;
  xpath_variable_node_set *pxStack_10;
  xpath_value_type type_local;
  
  switch(type) {
  case xpath_type_node_set:
    pxStack_10 = new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_node_set>
                           (name);
    break;
  case xpath_type_number:
    pxStack_10 = (xpath_variable_node_set *)
                 new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_number>(name);
    break;
  case xpath_type_string:
    pxStack_10 = (xpath_variable_node_set *)
                 new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_string>(name);
    break;
  case xpath_type_boolean:
    pxStack_10 = (xpath_variable_node_set *)
                 new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_boolean>(name)
    ;
    break;
  default:
    pxStack_10 = (xpath_variable_node_set *)0x0;
  }
  return &pxStack_10->super_xpath_variable;
}

Assistant:

PUGI_IMPL_FN xpath_variable* new_xpath_variable(xpath_value_type type, const char_t* name)
	{
		switch (type)
		{
		case xpath_type_node_set:
			return new_xpath_variable<xpath_variable_node_set>(name);

		case xpath_type_number:
			return new_xpath_variable<xpath_variable_number>(name);

		case xpath_type_string:
			return new_xpath_variable<xpath_variable_string>(name);

		case xpath_type_boolean:
			return new_xpath_variable<xpath_variable_boolean>(name);

		default:
			return 0;
		}
	}